

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtUnionFind.cpp
# Opt level: O2

void __thiscall cbtUnionFind::allocate(cbtUnionFind *this,int N)

{
  cbtElement local_8;
  
  local_8.m_id = 0;
  local_8.m_sz = 0;
  cbtAlignedObjectArray<cbtElement>::resize(&this->m_elements,N,&local_8);
  return;
}

Assistant:

void cbtUnionFind::allocate(int N)
{
	m_elements.resize(N);
}